

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

SchemaCatalogEntry * __thiscall duckdb::Binder::BindCreateSchema(Binder *this,CreateInfo *info)

{
  bool bVar1;
  SchemaCatalogEntry *pSVar2;
  BinderException *this_00;
  string local_40;
  
  pSVar2 = BindSchema(this,info);
  bVar1 = Catalog::IsSystemCatalog((pSVar2->super_InCatalogEntry).catalog);
  if (!bVar1) {
    return pSVar2;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot create entry in system catalog","");
  BinderException::BinderException(this_00,&local_40);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SchemaCatalogEntry &Binder::BindCreateSchema(CreateInfo &info) {
	auto &schema = BindSchema(info);
	if (schema.catalog.IsSystemCatalog()) {
		throw BinderException("Cannot create entry in system catalog");
	}
	return schema;
}